

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O0

void generateGradientTexture
               (PatternGeneration *pattern_generation,uint *resolution,uint *i,string *textures_dir,
               string *scripts_dir)

{
  byte bVar1;
  ostream *poVar2;
  vector<int,_std::allocator<int>_> local_1b8;
  _InputArray local_1a0;
  uint local_184;
  Scalar_ local_180 [8];
  Mat gradient_texture;
  undefined1 local_120 [8];
  Scalar gradient_color_2;
  int local_100 [2];
  Scalar gradient_color_1;
  string local_e0 [32];
  string local_c0 [48];
  string local_90 [8];
  string img_filename;
  string local_70 [8];
  string img_name;
  string local_50 [8];
  string material_name;
  string *scripts_dir_local;
  string *textures_dir_local;
  uint *i_local;
  uint *resolution_local;
  PatternGeneration *pattern_generation_local;
  
  std::__cxx11::string::string(local_50);
  std::__cxx11::string::string(local_70);
  std::__cxx11::string::string(local_90);
  genNames("gradient_",*i,textures_dir,(string *)local_50,(string *)local_70,(string *)local_90);
  std::__cxx11::string::string(local_c0,local_50);
  std::__cxx11::string::string(local_e0,local_70);
  genScript((string *)local_c0,(string *)local_e0,scripts_dir);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_c0);
  PatternGeneration::getRandomColor();
  PatternGeneration::getRandomColor();
  local_184 = *resolution;
  PatternGeneration::getGradientTexture
            (local_180,(Scalar_ *)pattern_generation,local_100,SUB81(local_120,0));
  cv::_InputArray::_InputArray(&local_1a0,(Mat *)local_180);
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_1b8);
  bVar1 = cv::imwrite(local_90,&local_1a0,(vector *)&local_1b8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_1b8);
  cv::_InputArray::~_InputArray(&local_1a0);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    cv::Mat::~Mat((Mat *)local_180);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"[ERROR] Could not save ");
  poVar2 = std::operator<<(poVar2,local_90);
  poVar2 = std::operator<<(poVar2,". Please ensure the destination folder exists!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void generateGradientTexture(PatternGeneration & pattern_generation,
    unsigned int & resolution,
    const unsigned int & i,
    std::string & textures_dir,
    std::string & scripts_dir)
{
    std::string material_name, img_name, img_filename;
    genNames("gradient_", i, textures_dir, material_name, img_name, img_filename);
    genScript(material_name, img_name, scripts_dir);
    if (!GENERATE_IMG) return;

    cv::Scalar gradient_color_1 = pattern_generation.getRandomColor();
    cv::Scalar gradient_color_2 = pattern_generation.getRandomColor();
    cv::Mat gradient_texture = pattern_generation.getGradientTexture(gradient_color_1, gradient_color_2, resolution, false);

    if (!cv::imwrite(img_filename, gradient_texture)){
    std::cout << "[ERROR] Could not save " << img_filename <<
        ". Please ensure the destination folder exists!" << std::endl;
        exit(EXIT_FAILURE);
    }

    if (SHOW_IMGS)
        cv::imshow("Gradient texture", gradient_texture);
}